

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

void __thiscall Polymer::Unlink(Polymer *this)

{
  bool bVar1;
  SpeciesTracker *this_00;
  FixedElement *this_01;
  string *promoter_name;
  enable_shared_from_this<Polymer> local_68;
  reference local_58;
  Interval<std::shared_ptr<BindingSite>,_unsigned_long> *interval;
  iterator __end1;
  iterator __begin1;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  *__range1;
  undefined1 local_28 [8];
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  results;
  Polymer *this_local;
  
  results.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::vector((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
            *)local_28);
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
            (&this->binding_sites_,(long)this->start_,(long)this->stop_,
             (vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
              *)local_28);
  __end1 = std::
           vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ::begin((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                    *)local_28);
  interval = (Interval<std::shared_ptr<BindingSite>,_unsigned_long> *)
             std::
             vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
             ::end((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                    *)local_28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
                                *)&interval);
    if (!bVar1) break;
    local_58 = __gnu_cxx::
               __normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
               ::operator*(&__end1);
    this_00 = SpeciesTracker::Instance();
    this_01 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_58->value)->super_FixedElement;
    promoter_name = FixedElement::name_abi_cxx11_(this_01);
    std::enable_shared_from_this<Polymer>::shared_from_this(&local_68);
    SpeciesTracker::Remove(this_00,promoter_name,(Ptr *)&local_68);
    std::shared_ptr<Polymer>::~shared_ptr((shared_ptr<Polymer> *)&local_68);
    __gnu_cxx::
    __normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~vector((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
             *)local_28);
  return;
}

Assistant:

void Polymer::Unlink() {
  // Remove all pointers to polymer from promoter-polymer map
  std::vector<Interval<BindingSite::Ptr>> results;
  binding_sites_.findOverlapping(start_, stop_, results);
  for (auto &interval : results) {
    // std::cout << "Destroying " + interval.value->name() + " \n" << std::endl;
    SpeciesTracker::Instance().Remove(interval.value->name(),
                                      shared_from_this());
  }
}